

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BX(DisasContext_conflict1 *s,arg_BX *a)

{
  TCGv_i32 var;
  uint uVar1;
  
  uVar1 = (uint)s->features;
  if ((uVar1 >> 0xe & 1) != 0) {
    var = load_reg(s,a->rm);
    gen_bx_excret(s,var);
  }
  return (_Bool)((byte)(uVar1 >> 0xe) & 1);
}

Assistant:

static bool trans_BX(DisasContext *s, arg_BX *a)
{
    if (!ENABLE_ARCH_4T) {
        return false;
    }
    gen_bx_excret(s, load_reg(s, a->rm));
    return true;
}